

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_serialize_totext(FILE *out)

{
  size_t sVar1;
  uint32_t uVar2;
  avl_iter_t *iter;
  lddmc_ser *plVar3;
  mddnode_t n_00;
  uint64_t uVar4;
  size_t sVar5;
  size_t sVar6;
  mddnode_t n;
  MDD mdd;
  lddmc_ser *s;
  avl_iter_t *it;
  FILE *out_local;
  
  iter = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);
  fprintf((FILE *)out,"[");
  while( true ) {
    plVar3 = lddmc_ser_reversed_iter_next(iter);
    if (plVar3 == (lddmc_ser *)0x0) break;
    n_00 = LDD_GETNODE(plVar3->mdd);
    sVar1 = plVar3->assigned;
    uVar2 = mddnode_getvalue(n_00);
    uVar4 = mddnode_getdown(n_00);
    sVar5 = lddmc_serialize_get(uVar4);
    uVar4 = mddnode_getright(n_00);
    sVar6 = lddmc_serialize_get(uVar4);
    fprintf((FILE *)out,"(%zu,v=%u,d=%zu,r=%zu),",sVar1,(ulong)uVar2,sVar5,sVar6);
  }
  fprintf((FILE *)out,"]");
  lddmc_ser_reversed_iter_free(iter);
  return;
}

Assistant:

void
lddmc_serialize_totext(FILE *out)
{
    avl_iter_t *it = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);
    struct lddmc_ser *s;

    fprintf(out, "[");
    while ((s=lddmc_ser_reversed_iter_next(it))) {
        MDD mdd = s->mdd;
        mddnode_t n = LDD_GETNODE(mdd);
        fprintf(out, "(%zu,v=%u,d=%zu,r=%zu),", s->assigned,
                                                mddnode_getvalue(n),
                                                lddmc_serialize_get(mddnode_getdown(n)),
                                                lddmc_serialize_get(mddnode_getright(n)));
    }
    fprintf(out, "]");

    lddmc_ser_reversed_iter_free(it);
}